

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O1

void __thiscall Screen_Manager::~Screen_Manager(Screen_Manager *this)

{
  Screen_Info *pSVar1;
  Screen_Info *pSVar2;
  
  pSVar2 = this->head;
  if (pSVar2 != (Screen_Info *)0x0) {
    do {
      pSVar1 = pSVar2->next;
      if (pSVar2 != (Screen_Info *)0x0) {
        if (pSVar2->name != (char *)0x0) {
          operator_delete__(pSVar2->name);
        }
        operator_delete(pSVar2);
      }
      pSVar2 = pSVar1;
    } while (pSVar1 != this->head);
  }
  return;
}

Assistant:

Screen_Manager::~Screen_Manager()
{
  if (head != nullptr) {
    Screen_Info *screen = head;
    do {
      Screen_Info *next_screen = screen->next;
      delete screen;
      screen = next_screen;
    } while (screen != head);
  }
}